

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase::sectionStarting(StreamingReporterBase *this,SectionInfo *_sectionInfo)

{
  undefined1 uVar1;
  ThreadedSectionInfo *this_00;
  ThreadedSectionInfo *pTVar2;
  SectionInfo *in_RDI;
  Ptr<Catch::ThreadedSectionInfo> sectionInfo;
  ThreadedSectionInfo *in_stack_ffffffffffffffa8;
  ThreadedSectionInfo *in_stack_ffffffffffffffb0;
  value_type *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  Ptr<Catch::ThreadedSectionInfo> local_18 [3];
  
  this_00 = (ThreadedSectionInfo *)operator_new(0x98);
  ThreadedSectionInfo::ThreadedSectionInfo
            (this_00,in_RDI,
             (ThreadedSectionInfo *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  Ptr<Catch::ThreadedSectionInfo>::Ptr
            ((Ptr<Catch::ThreadedSectionInfo> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8)
  ;
  uVar1 = Ptr<Catch::ThreadedSectionInfo>::operator!
                    ((Ptr<Catch::ThreadedSectionInfo> *)&in_RDI[3].field_0x28);
  if ((bool)uVar1) {
    Ptr<Catch::ThreadedSectionInfo>::operator=
              ((Ptr<Catch::ThreadedSectionInfo> *)this_00,(Ptr<Catch::ThreadedSectionInfo> *)in_RDI)
    ;
    std::
    vector<Catch::Ptr<Catch::ThreadedSectionInfo>,_std::allocator<Catch::Ptr<Catch::ThreadedSectionInfo>_>_>
    ::push_back((vector<Catch::Ptr<Catch::ThreadedSectionInfo>,_std::allocator<Catch::Ptr<Catch::ThreadedSectionInfo>_>_>
                 *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
  }
  else {
    pTVar2 = Ptr<Catch::ThreadedSectionInfo>::operator->
                       ((Ptr<Catch::ThreadedSectionInfo> *)&in_RDI[3].field_0x28);
    std::
    vector<Catch::Ptr<Catch::ThreadedSectionInfo>,_std::allocator<Catch::Ptr<Catch::ThreadedSectionInfo>_>_>
    ::push_back((vector<Catch::Ptr<Catch::ThreadedSectionInfo>,_std::allocator<Catch::Ptr<Catch::ThreadedSectionInfo>_>_>
                 *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),(value_type *)pTVar2);
    in_stack_ffffffffffffffb0 =
         Ptr<Catch::ThreadedSectionInfo>::get
                   ((Ptr<Catch::ThreadedSectionInfo> *)&in_RDI[3].field_0x28);
    pTVar2 = Ptr<Catch::ThreadedSectionInfo>::operator->(local_18);
    pTVar2->parent = in_stack_ffffffffffffffb0;
    Ptr<Catch::ThreadedSectionInfo>::operator=
              ((Ptr<Catch::ThreadedSectionInfo> *)this_00,(Ptr<Catch::ThreadedSectionInfo> *)in_RDI)
    ;
  }
  Ptr<Catch::ThreadedSectionInfo>::~Ptr
            ((Ptr<Catch::ThreadedSectionInfo> *)in_stack_ffffffffffffffb0);
  return;
}

Assistant:

virtual void sectionStarting( SectionInfo const& _sectionInfo ) {
            Ptr<ThreadedSectionInfo> sectionInfo = new ThreadedSectionInfo( _sectionInfo );
            if( !currentSectionInfo ) {
                currentSectionInfo = sectionInfo;
                m_rootSections.push_back( currentSectionInfo );
            }
            else {
                currentSectionInfo->children.push_back( sectionInfo );
                sectionInfo->parent = currentSectionInfo.get();
                currentSectionInfo = sectionInfo;
            }
        }